

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper *in_RDI;
  Vector3<double> *this_00;
  char *file;
  double extraout_XMM0_Qa;
  FP FVar3;
  AssertHelper *this_01;
  GammaType GVar4;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  GammaType expectedGamma;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int d_1;
  AssertionResult gtest_ar;
  int d;
  ParticleType particle;
  FactorType factor;
  ChargeType charge;
  MassType mass;
  MomentumType momentum;
  PositionType position;
  AssertHelper *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffda8;
  MomentumType *in_stack_fffffffffffffdb0;
  AssertHelper *message;
  PositionType *in_stack_fffffffffffffdb8;
  int iVar6;
  double dVar5;
  Particle<(pica::Dimension)3> *in_stack_fffffffffffffdc0;
  Real in_stack_fffffffffffffdc8;
  Type type;
  Particle<(pica::Dimension)3> *in_stack_fffffffffffffdd0;
  Real in_stack_fffffffffffffdd8;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffde0;
  Message *in_stack_fffffffffffffdf8;
  AssertionResult local_1e0;
  double *in_stack_fffffffffffffe30;
  double *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  char local_198 [8];
  FactorType local_190;
  AssertionResult local_188 [2];
  ChargeType local_168;
  AssertionResult local_160 [2];
  MassType local_140;
  AssertionResult local_138 [2];
  Vector3<double> local_118;
  AssertionResult local_100;
  int local_f0;
  uint local_ec;
  PositionType local_c8;
  AssertionResult local_b0;
  int local_9c;
  Particle<(pica::Dimension)3> local_98;
  undefined8 local_50;
  double local_48;
  double local_40;
  Vector3<double> local_38;
  Vector3<double> local_20;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::getPosition
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(Real)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  pica::Vector3<double>::Vector3(&local_38,-231300000000.0,0.0,1.23e-05);
  local_40 = pica::Constants<double>::electronMass();
  local_48 = pica::Constants<double>::electronCharge();
  local_50 = 0x4061800000000000;
  pica::Particle<(pica::Dimension)3>::Particle
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             (FactorType)in_stack_fffffffffffffda8,
             (TypeIndexType)((ulong)in_stack_fffffffffffffda0 >> 0x30));
  local_9c = 0;
  while( true ) {
    if (2 < local_9c) {
      local_f0 = 0;
      while( true ) {
        type = (Type)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
        if (2 < local_f0) {
          local_140 = pica::Particle<(pica::Dimension)3>::getMass(&local_98);
          testing::internal::EqHelper<false>::Compare<double,double>
                    ((char *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffda8,(double *)in_stack_fffffffffffffda0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
            testing::AssertionResult::failure_message((AssertionResult *)0x1f90b9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdd0,type,
                       (char *)in_stack_fffffffffffffdc0,
                       (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                       (char *)in_stack_fffffffffffffdb0);
            testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffdf8);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
            testing::Message::~Message((Message *)0x1f9116);
          }
          local_ec = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f919d);
          if (local_ec == 0) {
            local_168 = pica::Particle<(pica::Dimension)3>::getCharge(&local_98);
            testing::internal::EqHelper<false>::Compare<double,double>
                      ((char *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,
                       in_stack_fffffffffffffda8,(double *)in_stack_fffffffffffffda0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
              in_stack_fffffffffffffdd0 =
                   (Particle<(pica::Dimension)3> *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x1f9236);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffdd0,type,
                         (char *)in_stack_fffffffffffffdc0,
                         (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                         (char *)in_stack_fffffffffffffdb0);
              testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffdf8);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
              testing::Message::~Message((Message *)0x1f9293);
            }
            local_ec = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f931a);
            if (local_ec == 0) {
              local_190 = pica::Particle<(pica::Dimension)3>::getFactor(&local_98);
              pcVar2 = "factor";
              testing::internal::EqHelper<false>::Compare<double,double>
                        ((char *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,
                         in_stack_fffffffffffffda8,(double *)in_stack_fffffffffffffda0);
              iVar6 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1f93b3);
                type = (Type)((ulong)pcVar2 >> 0x20);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffdd0,type,
                           (char *)in_stack_fffffffffffffdc0,iVar6,(char *)in_stack_fffffffffffffdb0
                          );
                pcVar2 = local_198;
                testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffdf8);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
                testing::Message::~Message((Message *)0x1f9410);
              }
              local_ec = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f9497);
              if (local_ec == 0) {
                this_00 = &local_38;
                file = (char *)pica::Vector3<double>::norm2(this_00);
                dVar5 = local_40;
                pica::Constants<double>::c(this_00,pcVar2);
                FVar3 = pica::sqr(dVar5 * extraout_XMM0_Qa);
                iVar6 = (int)((ulong)dVar5 >> 0x20);
                this_01 = (AssertHelper *)sqrt((double)file / FVar3 + 1.0);
                in_RDI[3].data_ = (AssertHelperData *)0x3d719799812dea11;
                if (ABS((double)this_01) < (double)in_RDI[2].data_ ||
                    ABS((double)this_01) == (double)in_RDI[2].data_) {
                  pica::Particle<(pica::Dimension)3>::getGamma(&local_98);
                  testing::internal::CmpHelperLE<double,double>
                            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                             in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
                    testing::AssertionResult::failure_message((AssertionResult *)0x1f979f);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffffdd0,type,file,iVar6,
                               (char *)in_stack_fffffffffffffdb0);
                    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffdf8);
                    testing::internal::AssertHelper::~AssertHelper(this_01);
                    testing::Message::~Message((Message *)0x1f97eb);
                  }
                  local_ec = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f9866);
                }
                else {
                  message = this_01;
                  GVar4 = pica::Particle<(pica::Dimension)3>::getGamma(&local_98);
                  testing::internal::CmpHelperLE<double,double>
                            (in_stack_fffffffffffffe48,
                             (char *)(ABS((double)message - GVar4) / ABS((double)this_01)),
                             in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)&stack0xfffffffffffffe48);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
                    testing::AssertionResult::failure_message((AssertionResult *)0x1f95fe);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)in_stack_fffffffffffffdd0,type,file,iVar6,
                               (char *)message);
                    testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffdf8);
                    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
                    testing::Message::~Message((Message *)0x1f965b);
                  }
                  local_ec = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f96dc);
                }
              }
            }
          }
          return;
        }
        pica::Vector3<double>::operator[](&local_38,local_f0);
        pica::Particle<(pica::Dimension)3>::getMomentum(in_stack_fffffffffffffdd0);
        pica::Vector3<double>::operator[](&local_118,local_f0);
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((char *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,
                   in_stack_fffffffffffffda8,(double *)in_stack_fffffffffffffda0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
          testing::AssertionResult::failure_message((AssertionResult *)0x1f8f27);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffdd0,
                     (Type)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                     (char *)in_stack_fffffffffffffdc0,
                     (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                     (char *)in_stack_fffffffffffffdb0);
          testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffdf8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
          testing::Message::~Message((Message *)0x1f8f84);
        }
        local_ec = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f9008);
        if (local_ec != 0) break;
        local_f0 = local_f0 + 1;
      }
      return;
    }
    in_stack_fffffffffffffdf8 = (Message *)pica::Vector3<double>::operator[](&local_20,local_9c);
    pica::Particle<(pica::Dimension)3>::getPosition(&local_c8,&local_98);
    pica::Vector3<double>::operator[](&local_c8,local_9c);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffda8,(double *)in_stack_fffffffffffffda0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
      testing::AssertionResult::failure_message((AssertionResult *)0x1f8d58);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffdd0,
                 (Type)((ulong)in_stack_fffffffffffffdc8 >> 0x20),(char *)in_stack_fffffffffffffdc0,
                 (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),(char *)in_stack_fffffffffffffdb0);
      testing::internal::AssertHelper::operator=(in_RDI,in_stack_fffffffffffffdf8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffda0);
      testing::Message::~Message((Message *)0x1f8db5);
    }
    local_ec = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f8e39);
    if (local_ec != 0) break;
    local_9c = local_9c + 1;
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Constructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(3.1, -32.1, 4.3e-5);
    MomentumType momentum(-231.3e9, 0.0, 1.23e-5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    FactorType factor = static_cast<FactorType>(1.4e2);

    ParticleType particle(position, momentum, factor, 0);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(factor, particle.getFactor());
    GammaType expectedGamma = sqrt((FP)1 + momentum.norm2() / sqr(mass * Constants<GammaType >::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}